

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall
QAbstractItemViewPrivate::columnsAboutToBeRemoved
          (QAbstractItemViewPrivate *this,QModelIndex *parent,int start,int end)

{
  int iVar1;
  QEditorIndexHash *this_00;
  QAbstractItemView *this_01;
  QAbstractItemModel *pQVar2;
  Span *pSVar3;
  QWidget *this_02;
  QObject *pQVar4;
  undefined8 uVar5;
  Data *pDVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *pDVar10;
  long *plVar11;
  ulong uVar12;
  uint uVar13;
  size_t sVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  piter it;
  code *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  QModelIndex local_a8;
  QModelIndex local_88;
  void *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  QAbstractItemModel *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QAbstractItemView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  *(undefined4 *)(*(long *)(this_01 + 8) + 0x3a8) = 5;
  local_88.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex(&local_88,this_01);
  if ((((-1 < (local_88.r | local_88.c) && local_88.m.ptr != (QAbstractItemModel *)0x0) &&
       (this->selectionMode == SingleSelection)) && (start <= local_88.c)) && (local_88.c <= end)) {
    iVar8 = (**(code **)(*(long *)this->model + 0x80))();
    if (end - start < iVar8) {
      local_a8._0_8_ = (Data *)0xffffffffffffffff;
      local_a8.i = 0;
      local_a8.m.ptr = (QAbstractItemModel *)0x0;
      pQVar2 = this->model;
      if (local_88.m.ptr == (QAbstractItemModel *)0x0) {
        local_58._0_8_ = (Data *)0xffffffffffffffff;
        local_58._8_8_ = (QObject *)0x0;
        local_48 = (QAbstractItemModel *)0x0;
      }
      else {
        (**(code **)(*(long *)local_88.m.ptr + 0x68))(local_58,local_88.m.ptr,&local_88);
      }
      iVar9 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,local_58);
      iVar8 = end;
      if (end < iVar9) {
        do {
          while( true ) {
            uVar5 = local_88._0_8_;
            pQVar2 = this->model;
            if (local_88.m.ptr == (QAbstractItemModel *)0x0) {
              local_c0 = (code *)0xffffffffffffffff;
              local_b8 = 0;
              uStack_b0 = 0;
            }
            else {
              (**(code **)(*(long *)local_88.m.ptr + 0x68))(&local_c0,local_88.m.ptr,&local_88);
            }
            iVar1 = iVar8 + 1;
            (**(code **)(*(long *)pQVar2 + 0x60))
                      (local_58,pQVar2,uVar5 & 0xffffffff,iVar8,&local_c0);
            local_a8.m.ptr = local_48;
            local_a8._0_8_ = local_58._0_8_;
            local_a8.i = local_58._8_8_;
            cVar7 = (**(code **)(*(long *)this_01 + 0x2c0))(this_01,&local_a8);
            iVar8 = iVar1;
            if (cVar7 != '\0') break;
            uVar12 = (**(code **)(*(long *)this->model + 0x138))(this->model,&local_a8);
            if (((uVar12 & 0x20) != 0) || (iVar9 <= iVar1)) goto LAB_00545269;
          }
        } while (iVar1 < iVar9);
      }
LAB_00545269:
      QAbstractItemView::setCurrentIndex(this_01,&local_a8);
    }
    else {
      local_a8._0_8_ = *(undefined8 *)parent;
      local_a8.i = parent->i;
      local_a8.m.ptr = (parent->m).ptr;
      if (((-1 < parent->r) && (-1 < parent->c)) && (local_a8.m.ptr != (QAbstractItemModel *)0x0)) {
        pDVar6 = (Data *)local_a8._0_8_;
        while (local_a8._0_8_ = pDVar6,
              uVar12 = (**(code **)(*(long *)this->model + 0x138))(this->model,&local_a8),
              (uVar12 & 0x20) == 0) {
          if (local_a8.m.ptr == (QAbstractItemModel *)0x0) {
            local_58._0_8_ = (Data *)0xffffffffffffffff;
            local_58._8_8_ = (QObject *)0x0;
            local_48 = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)local_a8.m.ptr + 0x68))(local_58,local_a8.m.ptr,&local_a8);
          }
          local_a8.m.ptr = local_48;
          local_a8.r = local_58._0_4_;
          local_a8.c = local_58._4_4_;
          uVar5 = local_a8._0_8_;
          local_a8.i = local_58._8_8_;
          local_a8.r = (int)local_58._0_8_;
          bVar16 = local_a8.r < 0;
          local_a8._0_8_ = uVar5;
          if (((bVar16) || ((long)local_58._0_8_ < 0)) ||
             (pDVar6 = (Data *)local_58._0_8_, local_48 == (QAbstractItemModel *)0x0)) break;
        }
      }
      if (((-1 < local_a8.r) && (-1 < (long)local_a8._0_8_)) &&
         (local_a8.m.ptr != (QAbstractItemModel *)0x0)) {
        QAbstractItemView::setCurrentIndex(this_01,&local_a8);
      }
    }
  }
  this_00 = &this->editorIndexHash;
  pDVar10 = (this->editorIndexHash).d;
  if (pDVar10 == (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0) {
    pDVar10 = (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0;
  }
  else {
    if (1 < (uint)(pDVar10->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar10 = QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_>::detached
                          (pDVar10);
      this_00->d = pDVar10;
    }
    pDVar10 = this_00->d;
    if (pDVar10->spans->offsets[0] == 0xff) {
      uVar12 = 1;
      do {
        sVar14 = uVar12;
        if (pDVar10->numBuckets == sVar14) {
          pDVar10 = (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0;
          sVar14 = 0;
          break;
        }
        uVar12 = sVar14 + 1;
      } while (pDVar10->spans[sVar14 >> 7].offsets[(uint)sVar14 & 0x7f] == 0xff);
      goto LAB_005452f1;
    }
  }
  sVar14 = 0;
LAB_005452f1:
  it.bucket = sVar14;
  it.d = pDVar10;
  if (pDVar10 != (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0 || sVar14 != 0)
  {
    do {
      uVar15 = it.bucket;
      pDVar10 = it.d;
      local_a8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      uVar12 = uVar15 >> 7;
      uVar13 = (uint)it.bucket & 0x7f;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                (&local_a8,
                 (QPersistentModelIndex *)
                 (pDVar10->spans[uVar12].entries[pDVar10->spans[uVar12].offsets[uVar13]].storage.
                  data + 8));
      if (local_a8.c < end || start < local_a8.c) {
LAB_005453d2:
        do {
          if (pDVar10->numBuckets - 1 == uVar15) {
            it = (piter)ZEXT816(0);
            break;
          }
          uVar15 = uVar15 + 1;
          it.bucket = uVar15;
          it.d = pDVar10;
        } while (pDVar10->spans[uVar15 >> 7].offsets[(uint)uVar15 & 0x7f] == 0xff);
      }
      else {
        (**(code **)(*(long *)this->model + 0x68))(local_58,this->model,&local_a8);
        if (((local_58._0_4_ != parent->r) || (local_58._4_4_ != parent->c)) ||
           (((QObject *)local_58._8_8_ != (QObject *)parent->i || (local_48 != (parent->m).ptr))))
        goto LAB_005453d2;
        pSVar3 = pDVar10->spans;
        this_02 = *(QWidget **)pSVar3[uVar12].entries[pSVar3[uVar12].offsets[uVar13]].storage.data;
        local_48 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QHash<QPersistentModelIndex,_QEditorInfo>::takeImpl<QPersistentModelIndex>
                  ((QEditorInfo *)local_58,&this->indexEditorHash,
                   (QPersistentModelIndex *)
                   (pSVar3[uVar12].entries[pSVar3[uVar12].offsets[uVar13]].storage.data + 8));
        it = (piter)QHash<QWidget_*,_QPersistentModelIndex>::erase(this_00,(const_iterator)it);
        if (((((Data *)local_58._0_8_ != (Data *)0x0) && (*(int *)(local_58._0_8_ + 4) != 0)) &&
            ((QObject *)local_58._8_8_ != (QObject *)0x0)) && (this_02 != (QWidget *)0x0)) {
          pQVar4 = *(QObject **)
                    &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                     super_QWidgetPrivate.field_0x8;
          local_c0 = QObject::destroyed;
          local_b8 = 0;
          local_68 = (void *)0x2a1;
          local_60 = 0;
          QObject::disconnectImpl
                    (&this_02->super_QObject,&local_c0,pQVar4,&local_68,
                     (QMetaObject *)&QObject::staticMetaObject);
          QObject::removeEventFilter(&this_02->super_QObject);
          QWidget::hide(this_02);
          plVar11 = (long *)(**(code **)(*(long *)pQVar4 + 0x208))(pQVar4,&local_a8);
          if (plVar11 == (long *)0x0) {
            QObject::deleteLater();
          }
          else {
            (**(code **)(*plVar11 + 0x78))(plVar11,this_02,&local_a8);
          }
        }
        if ((Data *)local_58._0_8_ != (Data *)0x0) {
          LOCK();
          *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
          UNLOCK();
          if ((*(int *)local_58._0_8_ == 0) && ((Data *)local_58._0_8_ != (Data *)0x0)) {
            operator_delete((void *)local_58._0_8_);
          }
        }
      }
    } while ((it.d != (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0) ||
            (it.bucket != 0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::columnsAboutToBeRemoved(const QModelIndex &parent, int start, int end)
{
    Q_Q(QAbstractItemView);

    q->setState(QAbstractItemView::CollapsingState);

    // Ensure one selected item in single selection mode.
    QModelIndex current = q->currentIndex();
    if (current.isValid()
        && selectionMode == QAbstractItemView::SingleSelection
        && current.column() >= start
        && current.column() <= end) {
        int totalToRemove = end - start + 1;
        if (model->columnCount(parent) < totalToRemove) { // no more columns
            QModelIndex index = parent;
            while (index.isValid() && !isIndexEnabled(index))
                index = index.parent();
            if (index.isValid())
                q->setCurrentIndex(index);
        } else {
            int column = end;
            QModelIndex next;
            const int columnCount = model->columnCount(current.parent());
            // find the next visible and enabled item
            while (column < columnCount) {
                next = model->index(current.row(), column++, current.parent());
#ifdef QT_DEBUG
                if (!next.isValid()) {
                    qWarning("Model unexpectedly returned an invalid index");
                    break;
                }
#endif
                if (!q->isIndexHidden(next) && isIndexEnabled(next))
                    break;
            }
            q->setCurrentIndex(next);
        }
    }

    // Remove all affected editors; this is more efficient than waiting for updateGeometries() to clean out editors for invalid indexes
    QEditorIndexHash::iterator it = editorIndexHash.begin();
    while (it != editorIndexHash.end()) {
        QModelIndex index = it.value();
        if (index.column() <= start && index.column() >= end && model->parent(index) == parent) {
            QWidget *editor = it.key();
            QEditorInfo info = indexEditorHash.take(it.value());
            it = editorIndexHash.erase(it);
            if (info.widget)
                releaseEditor(editor, index);
        } else {
            ++it;
        }
    }

}